

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<double> fmt::v7::detail::dragonbox::to_decimal<double>(double x)

{
  carrier_uint two_f;
  carrier_uint two_f_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  uint uVar10;
  int iVar11;
  uint32_t uVar12;
  byte bVar13;
  int iVar14;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar15;
  char cVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  int in_ESI;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  decimal_fp<double> dVar24;
  cache_entry_type cache;
  
  uVar22 = (ulong)x & 0xfffffffffffff;
  if (((ulong)x & 0x7ff0000000000000) == 0) {
    uVar23 = 0xfffffbce;
    if (uVar22 == 0) {
      uVar15 = 0;
      uVar21 = 0;
      goto LAB_00112adc;
    }
LAB_00112721:
    uVar10 = floor_log10_pow2(uVar23);
    uVar15 = (ulong)uVar10;
    iVar14 = uVar10 - 2;
    cache.internal_._0_8_ =
         cache_accessor<double>::get_cached_power((uint128_wrapper *)(ulong)(2 - uVar10),in_ESI);
    cache.internal_._8_8_ = extraout_RDX;
    iVar11 = floor_log2_pow10(2 - uVar10);
    iVar11 = iVar11 + uVar23;
    two_f = uVar22 * 2 + 1;
    uVar21 = two_f << ((byte)iVar11 & 0x3f);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = cache.internal_._8_8_;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar21;
    two_f_00 = uVar22 * 2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar21;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (uint128_wrapper *)cache.internal_;
    uVar19 = SUB168(auVar4 * auVar7,8) +
             (ulong)CARRY8(SUB168(auVar5 * auVar8,8),SUB168(auVar4 * auVar7,0));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar19;
    uVar21 = SUB168(auVar6 * ZEXT816(0x83126e978d4fdf3c),8) >> 9;
    uVar17 = (int)uVar19 + (int)uVar21 * -1000;
    uVar20 = (uint)(cache.internal_._8_8_ >> (~(byte)iVar11 & 0x3f));
    if (uVar20 < uVar17) {
LAB_00112a02:
      iVar18 = uVar17 - (uVar20 >> 1);
      uVar12 = iVar18 + 0x32;
      if ((uVar12 & 3) == 0) {
        uVar10 = (uVar12 >> 2) * 0xa429;
        uVar21 = uVar21 * 10 + (ulong)(uVar10 >> 0x14);
        if ((uVar10 & 0xff) < 0xb) {
          bVar9 = cache_accessor<double>::compute_mul_parity(two_f_00,&cache,iVar11);
          if (bVar9 == (bool)((byte)iVar18 & 1)) {
            bVar9 = is_center_integer<double>(two_f_00,uVar23,iVar14);
            if (bVar9) {
              uVar21 = uVar21 & 0xfffffffffffffffe;
            }
          }
          else {
            uVar21 = uVar21 - 1;
          }
        }
      }
      else {
        uVar12 = small_division_by_pow10<2>(uVar12);
        uVar21 = uVar21 * 10 + (ulong)uVar12;
      }
      goto LAB_00112adc;
    }
    if (uVar17 < uVar20) {
      if (((uVar17 == 0) && ((uVar22 & 1) != 0)) &&
         (bVar9 = is_endpoint_integer<double>(two_f,uVar23,iVar14), bVar9)) {
        uVar21 = uVar21 - 1;
        uVar17 = 1000;
        goto LAB_00112a02;
      }
    }
    else if ((((uVar22 & 1) != 0) ||
             (bVar9 = is_endpoint_integer<double>(two_f_00 - 1,uVar23,iVar14), !bVar9)) &&
            (bVar9 = cache_accessor<double>::compute_mul_parity(two_f_00 - 1,&cache,iVar11), !bVar9)
            ) goto LAB_00112a02;
    iVar11 = uVar10 + 1;
    uVar22 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
      }
    }
    uVar23 = (uint)uVar22;
    uVar15 = 0x10;
    if (uVar23 < 0x10) {
      uVar15 = uVar22;
    }
    if (uVar22 < 8) {
      if (uVar22 == 0) goto LAB_00112ace;
    }
    else if (uVar21 * -0x3898f8b4dd16f1df < 0x2af31dc46119) {
      iVar14 = 8;
      uVar23 = (uint)(uVar21 * -0x3898f8b4dd16f1df >> 8);
      while ((iVar18 = (int)uVar15, (int)uVar15 != iVar14 &&
             (iVar18 = iVar14, uVar23 * -0x33333333 < 0x33333334))) {
        iVar14 = iVar14 + 1;
        uVar23 = uVar23 * -0x33333333;
      }
LAB_00112ad4:
      uVar21 = (ulong)(uVar23 >> ((char)iVar18 - 8U & 0x1f));
      goto LAB_00112ada;
    }
    iVar18 = 0;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar21;
    uVar22 = SUB168(auVar2 / ZEXT816(100000000),0);
    iVar14 = (int)uVar21 + SUB164(auVar2 / ZEXT816(100000000),0) * -100000000;
    uVar10 = iVar14 * -0x33333333;
    if (uVar10 < 0x33333334) {
      if ((uVar23 == 1) || (0x33333333 < (uint)(iVar14 * -0x3d70a3d7))) {
LAB_00112abf:
        uVar21 = uVar22 * 10000000 + (ulong)(uVar10 >> 1);
        iVar18 = 1;
      }
      else if ((uVar23 == 2) || (uVar10 = iVar14 * 0x26e978d5, 0x33333333 < uVar10)) {
        uVar21 = uVar22 * 1000000 + (ulong)((uint)(iVar14 * -0x3d70a3d7) >> 2);
        iVar18 = 2;
      }
      else if ((uVar23 == 3) || (uVar20 = iVar14 * 0x3afb7e91, 0x33333333 < uVar20)) {
LAB_00112b90:
        uVar21 = uVar22 * 100000 + (ulong)(uVar10 >> 3);
        iVar18 = 3;
      }
      else if ((uVar23 == 4) || (uVar10 = iVar14 * 0xbcbe61d, 0x33333333 < uVar10)) {
LAB_00112bd1:
        uVar21 = uVar22 * 10000 + (ulong)(uVar20 >> 4);
        iVar18 = 4;
      }
      else if ((uVar23 == 5) || (uVar20 = iVar14 * 0x68c26139, 0x33333333 < uVar20)) {
LAB_00112c12:
        uVar21 = uVar22 * 1000 + (ulong)(uVar10 >> 5);
        iVar18 = 5;
      }
      else if ((uVar23 == 6) || (uVar23 = iVar14 * -0x5172b95b, 0x33333333 < uVar23)) {
LAB_00112c53:
        uVar21 = uVar22 * 100 + (ulong)(uVar20 >> 6);
        iVar18 = 6;
      }
      else {
LAB_00112c6b:
        uVar21 = uVar22 * 10 + (ulong)(uVar23 >> 7);
        iVar18 = 7;
      }
    }
  }
  else {
    uVar23 = (uint)(((ulong)x & 0x7ff0000000000000) >> 0x34) - 0x433;
    if (uVar22 != 0) {
      uVar22 = uVar22 + 0x10000000000000;
      goto LAB_00112721;
    }
    uVar10 = floor_log10_pow2_minus_log10_4_over_3(uVar23);
    uVar15 = (ulong)uVar10;
    iVar11 = floor_log2_pow10(-uVar10);
    cVar16 = (char)iVar11 + (char)uVar23;
    cache_accessor<double>::get_cached_power((uint128_wrapper *)(ulong)-uVar10,in_ESI);
    bVar13 = 0xb - cVar16;
    uVar22 = (extraout_RDX_00 >> 0x35) + extraout_RDX_00 >> (bVar13 & 0x3f);
    uVar19 = (ulong)((uVar23 & 0xfffffffe) != 2) +
             (extraout_RDX_00 - (extraout_RDX_00 >> 0x36) >> (bVar13 & 0x3f));
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar22;
    uVar21 = SUB168(auVar1 / ZEXT816(10),0);
    if (uVar21 * 10 < uVar19) {
      uVar22 = (extraout_RDX_00 >> (10U - cVar16 & 0x3f)) + 1 >> 1;
      if (uVar23 == 0xffffffb3) {
        uVar21 = uVar22 & 0xfffffffffffffffe;
      }
      else {
        uVar21 = uVar22 + (uVar22 < uVar19);
      }
      goto LAB_00112adc;
    }
    iVar11 = uVar10 + 1;
    uVar15 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
      }
    }
    uVar23 = (uint)uVar15;
    uVar19 = 0x10;
    if (uVar23 < 0x10) {
      uVar19 = uVar15;
    }
    if (7 < uVar15) {
      if (uVar21 * -0x3898f8b4dd16f1df < 0x2af31dc46119) {
        iVar14 = 8;
        uVar23 = (uint)(uVar21 * -0x3898f8b4dd16f1df >> 8);
        while ((iVar18 = (int)uVar19, (int)uVar19 != iVar14 &&
               (iVar18 = iVar14, uVar23 * -0x33333333 < 0x33333334))) {
          iVar14 = iVar14 + 1;
          uVar23 = uVar23 * -0x33333333;
        }
        goto LAB_00112ad4;
      }
LAB_00112a7d:
      iVar18 = 0;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar22;
      uVar17 = SUB164(auVar3 / ZEXT816(1000000000),0);
      iVar14 = uVar17 * -100000000 + SUB164(auVar1 / ZEXT816(10),0);
      uVar10 = iVar14 * -0x33333333;
      if (0x33333333 < uVar10) goto LAB_00112ada;
      if ((uVar23 != 1) && ((uint)(iVar14 * -0x3d70a3d7) < 0x33333334)) {
        if ((uVar23 == 2) || (uVar10 = iVar14 * 0x26e978d5, 0x33333333 < uVar10)) {
          iVar18 = 2;
          uVar21 = (ulong)uVar17 * 1000000 + (ulong)((uint)(iVar14 * -0x3d70a3d7) >> 2);
          goto LAB_00112ada;
        }
        if ((uVar23 != 3) && (uVar20 = iVar14 * 0x3afb7e91, uVar20 < 0x33333334)) {
          if ((uVar23 != 4) && (uVar10 = iVar14 * 0xbcbe61d, uVar10 < 0x33333334)) {
            if ((uVar23 != 5) && (uVar20 = iVar14 * 0x68c26139, uVar20 < 0x33333334)) {
              if ((uVar23 != 6) && (uVar23 = iVar14 * -0x5172b95b, uVar23 < 0x33333334)) {
                uVar22 = (ulong)uVar17;
                goto LAB_00112c6b;
              }
              uVar22 = (ulong)uVar17;
              goto LAB_00112c53;
            }
            uVar22 = (ulong)uVar17;
            goto LAB_00112c12;
          }
          uVar22 = (ulong)uVar17;
          goto LAB_00112bd1;
        }
        uVar22 = (ulong)uVar17;
        goto LAB_00112b90;
      }
      uVar22 = (ulong)uVar17;
      goto LAB_00112abf;
    }
    if (uVar15 != 0) goto LAB_00112a7d;
LAB_00112ace:
    iVar18 = 0;
  }
LAB_00112ada:
  uVar15 = (ulong)(uint)(iVar11 + iVar18);
LAB_00112adc:
  dVar24._8_8_ = uVar15;
  dVar24.significand = uVar21;
  return dVar24;
}

Assistant:

FMT_SAFEBUFFERS decimal_fp<T> to_decimal(T x) FMT_NOEXCEPT {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << float_info<T>::significand_bits) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent = static_cast<int>((br & exponent_mask<T>()) >>
                                  float_info<T>::significand_bits);

  if (exponent != 0) {  // Check if normal.
    exponent += float_info<T>::exponent_bias - float_info<T>::significand_bits;

    // Shorter interval case; proceed like Schubfach.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |=
        (static_cast<carrier_uint>(1) << float_info<T>::significand_bits);
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent = float_info<T>::min_exponent - float_info<T>::significand_bits;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta_minus_1 = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta_minus_1);
  const carrier_uint two_fc = significand << 1;
  const carrier_uint two_fr = two_fc | 1;
  const carrier_uint zi =
      cache_accessor<T>::compute_mul(two_fr << beta_minus_1, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(zi);
  uint32_t r = static_cast<uint32_t>(zi - float_info<T>::big_divisor *
                                              ret_value.significand);

  if (r > deltai) {
    goto small_divisor_case_label;
  } else if (r < deltai) {
    // Exclude the right endpoint if necessary
    if (r == 0 && !include_right_endpoint &&
        is_endpoint_integer<T>(two_fr, exponent, minus_k)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else {
    // r == deltai; compare fractional parts
    // Check conditions in the order different from the paper
    // to take advantage of short-circuiting
    const carrier_uint two_fl = two_fc - 1;
    if ((!include_left_endpoint ||
         !is_endpoint_integer<T>(two_fl, exponent, minus_k)) &&
        !cache_accessor<T>::compute_mul_parity(two_fl, cache, beta_minus_1)) {
      goto small_divisor_case_label;
    }
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  const uint32_t mask = (1u << float_info<T>::kappa) - 1;
  auto dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);

  // Is dist divisible by 2^kappa?
  if ((dist & mask) == 0) {
    const bool approx_y_parity =
        ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;
    dist >>= float_info<T>::kappa;

    // Is dist divisible by 5^kappa?
    if (check_divisibility_and_divide_by_pow5<float_info<T>::kappa>(dist)) {
      ret_value.significand += dist;

      // Check z^(f) >= epsilon^(f)
      // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
      // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f)
      // Since there are only 2 possibilities, we only need to care about the
      // parity. Also, zi and r should have the same parity since the divisor
      // is an even number
      if (cache_accessor<T>::compute_mul_parity(two_fc, cache, beta_minus_1) !=
          approx_y_parity) {
        --ret_value.significand;
      } else {
        // If z^(f) >= epsilon^(f), we might have a tie
        // when z^(f) == epsilon^(f), or equivalently, when y is an integer
        if (is_center_integer<T>(two_fc, exponent, minus_k)) {
          ret_value.significand = ret_value.significand % 2 == 0
                                      ? ret_value.significand
                                      : ret_value.significand - 1;
        }
      }
    }
    // Is dist not divisible by 5^kappa?
    else {
      ret_value.significand += dist;
    }
  }
  // Is dist not divisible by 2^kappa?
  else {
    // Since we know dist is small, we might be able to optimize the division
    // better than the compiler; we are computing dist / small_divisor here
    ret_value.significand +=
        small_division_by_pow10<float_info<T>::kappa>(dist);
  }
  return ret_value;
}